

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O2

void __thiscall
afsm::
priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
::process_deferred_queue
          (priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
           *this)

{
  mutex_type *__mutex;
  pointer ppVar1;
  event_process_result eVar2;
  pointer ppVar3;
  pointer ppVar4;
  event_queue deferred;
  lock_guard lock;
  
  deferred.c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deferred.c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deferred.c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __mutex = &this->deferred_mutex_;
  std::mutex::lock(__mutex);
  ppVar4 = (this->deferred_events_).c.
           super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->deferred_events_).c.
           super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  deferred.c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->deferred_events_).c.
       super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->deferred_events_).c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->deferred_events_).c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->deferred_events_).c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deferred.c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = ppVar4;
  deferred.c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  do {
    if (ppVar4 == ppVar3) {
      std::
      vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
      ::~vector(&deferred.c);
      return;
    }
    detail::observer_wrapper<afsm::test::test_fsm_observer>::
    start_process_deferred_queue<afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
              (&this->super_observer_wrapper<afsm::test::test_fsm_observer>,this,
               ((long)ppVar3 - (long)ppVar4) / 0x28);
    eVar2 = refuse;
    do {
      if (deferred.c.
          super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          deferred.c.
          super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00403290;
      eVar2 = std::function<afsm::actions::event_process_result_()>::operator()
                        (&(deferred.c.
                           super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first);
      std::
      priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
      ::pop(&deferred);
    } while (eVar2 != process);
    eVar2 = process;
LAB_00403290:
    std::mutex::lock(__mutex);
    while (deferred.c.
           super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           deferred.c.
           super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
      ::push(&this->deferred_events_,
             deferred.c.
             super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
      std::
      priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
      ::pop(&deferred);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    detail::observer_wrapper<afsm::test::test_fsm_observer>::
    end_process_deferred_queue<afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
              (&this->super_observer_wrapper<afsm::test::test_fsm_observer>,this,
               ((long)(this->deferred_events_).c.
                      super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->deferred_events_).c.
                     super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x28);
    ppVar3 = deferred.c.
             super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar4 = deferred.c.
             super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (eVar2 == process) {
      ppVar4 = (this->deferred_events_).c.
               super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 = (this->deferred_events_).c.
               super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar1 = (this->deferred_events_).c.
               super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->deferred_events_).c.
      super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           deferred.c.
           super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (this->deferred_events_).c.
      super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           deferred.c.
           super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (this->deferred_events_).c.
      super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           deferred.c.
           super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      deferred.c.
      super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = ppVar4;
      deferred.c.
      super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
      deferred.c.
      super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar1;
    }
  } while( true );
}

Assistant:

void
    process_deferred_queue()
    {
        using actions::event_process_result;
        event_queue deferred;
        {
            lock_guard lock{deferred_mutex_};
            ::std::swap(deferred_events_, deferred);
        }
        while (!deferred.empty()) {
            observer_wrapper::start_process_deferred_queue(*this, deferred.size());
            auto res = event_process_result::refuse;
            while (!deferred.empty()) {
                res = deferred.top().first();
                deferred.pop();
                if (res == event_process_result::process)
                    break;
            }
            {
                lock_guard lock{deferred_mutex_};
                while (!deferred.empty()) {
                    deferred_events_.push(deferred.top());
                    deferred.pop();
                }
            }
            observer_wrapper::end_process_deferred_queue(*this, deferred_events_.size());
            if (res == event_process_result::process) {
                ::std::swap(deferred_events_, deferred);
            }
        }
    }